

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
          (optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> local_38;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if ((bVar3) || ((this->_blocked & 1U) != 0)) {
LAB_001d7276:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  }
  else {
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 0) goto LAB_001d7276;
      pvVar1 = (this->_value).v_.vtable;
      if (pvVar1 != (vtable_type *)0x0) {
        uVar2 = (*pvVar1->type_id)();
        if (uVar2 == 1) goto LAB_001d7276;
      }
    }
    tinyusdz::value::Value::
    get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
              (&local_38,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) {
      *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
           local_38.contained.data.__align;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_38.contained._16_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }